

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

bool __thiscall
helics::apps::Connector::addConnectionVector
          (Connector *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *connection)

{
  string_view interface2;
  string_view interface2_00;
  string_view interface1;
  string_view interface1_00;
  string_view direction_00;
  bool bVar1;
  size_type sVar2;
  _Optional_payload_base<helics::apps::InterfaceDirection> this_00;
  value_type *pvVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  size_t ii;
  optional<helics::apps::InterfaceDirection> directionValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newTags;
  InterfaceDirection direction;
  InterfaceDirection in_stack_000000cc;
  Connector *in_stack_000000d0;
  size_t in_stack_000000d8;
  char *in_stack_000000f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  value_type *in_stack_ffffffffffffff18;
  value_type *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  value_type *local_a0;
  bool local_1;
  
  sVar2 = CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RSI);
  if (sVar2 < 2) {
    local_1 = false;
  }
  else {
    sVar2 = CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RSI);
    if (sVar2 == 2) {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RSI,0);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff10);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RSI,1);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff10);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1eee8b);
      interface1._M_str = in_stack_000000f0;
      interface1._M_len = (size_t)this;
      interface2._M_str = (char *)connection;
      interface2._M_len = in_stack_000000d8;
      addConnection(in_stack_000000d0,interface1,interface2,in_stack_000000cc,in_stack_00000100);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_ffffffffffffff20);
      local_1 = true;
    }
    else {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1eef1c);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RSI,2);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff10);
      direction_00._M_str = in_stack_ffffffffffffff28;
      direction_00._M_len = (size_t)in_stack_ffffffffffffff20;
      this_00 = (_Optional_payload_base<helics::apps::InterfaceDirection>)getDirection(direction_00)
      ;
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<helics::apps::InterfaceDirection> *)0x1eef6a);
      if (bVar1) {
        CLI::std::optional<helics::apps::InterfaceDirection>::operator*
                  ((optional<helics::apps::InterfaceDirection> *)0x1eef7a);
      }
      else {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RSI,2);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00,in_stack_ffffffffffffff18);
      }
      local_a0 = (value_type *)0x3;
      while( true ) {
        __x = local_a0;
        pvVar3 = (value_type *)
                 CLI::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(in_RSI);
        if (pvVar3 <= __x) break;
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RSI,(size_type)local_a0);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00,__x);
        local_a0 = (value_type *)((long)&(local_a0->_M_dataplus)._M_p + 1);
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RSI,0);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff10);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RSI,1);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff10);
      interface1_00._M_str = in_stack_000000f0;
      interface1_00._M_len = (size_t)this;
      interface2_00._M_str = (char *)connection;
      interface2_00._M_len = in_stack_000000d8;
      addConnection(in_stack_000000d0,interface1_00,interface2_00,in_stack_000000cc,
                    in_stack_00000100);
      local_1 = true;
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
    }
  }
  return local_1;
}

Assistant:

bool Connector::addConnectionVector(const std::vector<std::string>& connection)
{
    if (connection.size() <= 1) {
        return false;
    }
    if (connection.size() == 2) {
        addConnection(connection[0], connection[1]);
        return true;
    }

    InterfaceDirection direction{InterfaceDirection::BIDIRECTIONAL};
    std::vector<std::string> newTags;
    auto directionValue = getDirection(connection[2]);
    if (directionValue) {
        direction = *directionValue;
    } else {
        newTags.push_back(connection[2]);
    }

    for (std::size_t ii = 3; ii < connection.size(); ++ii) {
        newTags.push_back(connection[ii]);
    }
    addConnection(connection[0], connection[1], direction, newTags);
    return true;
}